

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  int iVar1;
  LogMessage *pLVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  int bytes;
  uint8_t *buffer_base;
  int total_written;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [19];
  Voidify local_25;
  int local_24;
  void *pvStack_20;
  int size_local;
  void *buffer_local;
  CopyingFileOutputStream *this_local;
  
  local_24 = size;
  pvStack_20 = buffer;
  buffer_local = this;
  if ((this->is_closed_ & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"!is_closed_");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xc2,local_48._M_len,local_48._M_str);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_25,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  buffer_base._0_4_ = 0;
  while( true ) {
    if (local_24 <= (int)buffer_base) {
      return true;
    }
    do {
      sVar3 = write(this->file_,(void *)((long)buffer + (long)(int)buffer_base),
                    (long)(local_24 - (int)buffer_base));
      iVar1 = (int)sVar3;
      bVar5 = false;
      if (iVar1 < 0) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (iVar1 < 1) break;
    buffer_base._0_4_ = iVar1 + (int)buffer_base;
  }
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    this->errno_ = *piVar4;
  }
  return false;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  ABSL_CHECK(!is_closed_);
  int total_written = 0;

  const uint8_t* buffer_base = reinterpret_cast<const uint8_t*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}